

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O3

uint __thiscall chrono::fea::ChHexahedronFace::GetSubBlockOffset(ChHexahedronFace *this,int nblock)

{
  uint uVar1;
  undefined1 local_18 [16];
  
  GetNodeN((ChHexahedronFace *)local_18,(int)this);
  uVar1 = *(uint *)(local_18._0_8_ + 0xc + *(long *)(*(long *)local_18._0_8_ + -0x18));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_);
  }
  return uVar1;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return GetNodeN(nblock)->NodeGetOffset_w(); }